

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeInfo.cpp
# Opt level: O0

void __thiscall TypeInfo::inform_type(TypeInfo *this,string *name)

{
  bool bVar1;
  TypeSpec *in_RSI;
  GoalType typ;
  GoalType *in_stack_fffffffffffffef8;
  GoalType *in_stack_ffffffffffffff00;
  allocator local_d1;
  string local_d0 [48];
  TypeSpec *in_stack_ffffffffffffff60;
  string *in_stack_ffffffffffffff68;
  TypeInfo *in_stack_ffffffffffffff70;
  string local_68 [72];
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GoalType>,_true>
  local_20;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GoalType>,_true>
  local_18;
  TypeSpec *local_10;
  
  local_10 = in_RSI;
  local_18._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GoalType,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GoalType>_>_>
       ::find((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GoalType,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GoalType>_>_>
               *)in_stack_fffffffffffffef8,(key_type *)0x1e03a1);
  local_20._M_cur =
       (__node_type *)
       std::
       unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GoalType,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GoalType>_>_>
       ::end((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GoalType,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GoalType>_>_>
              *)in_stack_fffffffffffffef8);
  bVar1 = std::__detail::operator==(&local_18,&local_20);
  if (bVar1) {
    std::__cxx11::string::string(local_68,(string *)local_10);
    GoalType::GoalType(in_stack_ffffffffffffff00,&in_stack_fffffffffffffef8->m_name);
    std::__cxx11::string::~string(local_68);
    std::
    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GoalType,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GoalType>_>_>
    ::operator[]((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GoalType,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GoalType>_>_>
                  *)in_stack_ffffffffffffff00,&in_stack_fffffffffffffef8->m_name);
    GoalType::operator=(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
    GoalType::~GoalType((GoalType *)0x1e044e);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,"type",&local_d1);
  TypeSpec::TypeSpec(local_10,&in_stack_fffffffffffffef8->m_name);
  inform_symbol(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60);
  TypeSpec::~TypeSpec(local_10);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  return;
}

Assistant:

void TypeInfo::inform_type(const std::string& name) {
  if (m_types.find(name) == m_types.end()) {
    GoalType typ(name);
    m_types[name] = typ;
  }
  inform_symbol(name, TypeSpec("type"));
}